

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

uint64_t compute_chunk_unpack_size
                   (int x,int y,int width,int height,int lpc,exr_const_priv_part_t part)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_00000084;
  long lVar10;
  uint64_t uVar11;
  ulong uVar12;
  
  lVar10 = CONCAT44(in_register_00000084,lpc);
  if ((width == height) && (*(short *)(lVar10 + 0xf2) == 0)) {
    uVar11 = *(uint64_t *)(lVar10 + 0xe8);
  }
  else {
    puVar2 = *(uint **)(*(long *)(lVar10 + 0x20) + 0x18);
    uVar1 = *puVar2;
    uVar5 = (width + x) - 1;
    uVar3 = 1 - (width + x);
    if (0 < width + x) {
      uVar3 = uVar5;
    }
    uVar12 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar12;
    }
    uVar11 = 0;
    for (; uVar8 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
      lVar10 = *(long *)(puVar2 + 2);
      iVar7 = *(int *)(lVar10 + 0x18 + uVar12);
      iVar4 = 1;
      if (iVar7 < 2) {
        iVar4 = y;
      }
      if (1 < iVar7 && y != 1) {
        iVar4 = y / iVar7;
      }
      uVar1 = *(uint *)(lVar10 + 0x1c + uVar12);
      uVar6 = width;
      if (1 < (int)uVar1) {
        iVar7 = x % (int)uVar1;
        if (width == 1) {
          uVar6 = (uint)(iVar7 == 0);
        }
        else {
          iVar9 = uVar1 - iVar7;
          if (iVar7 == 0) {
            iVar9 = 0;
          }
          uVar6 = 0;
          iVar7 = uVar5 - uVar3 % uVar1;
          if (iVar9 + x <= iVar7) {
            uVar6 = (iVar7 - (iVar9 + x)) / (int)uVar1 + 1;
          }
        }
      }
      uVar11 = uVar11 + ((long)iVar4 << (2U - (*(int *)(lVar10 + 0x10 + uVar12) == 1) & 0x3f)) *
                        (long)(int)uVar6;
    }
  }
  return uVar11;
}

Assistant:

static uint64_t
compute_chunk_unpack_size (
    int x, int y, int width, int height, int lpc, exr_const_priv_part_t part)
{
    uint64_t unpacksize = 0;
    if (part->chan_has_line_sampling || height != lpc)
    {
        const exr_attr_chlist_t* chanlist = part->channels->chlist;
        for (int c = 0; c < chanlist->num_channels; ++c)
        {
            const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
            uint64_t chansz = ((curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4);

            chansz *=
                (uint64_t) compute_sampled_width (width, curc->x_sampling, x);
            chansz *=
                (uint64_t) compute_sampled_height (height, curc->y_sampling, y);

            unpacksize += chansz;
        }
    }
    else
        unpacksize = part->unpacked_size_per_chunk;
    return unpacksize;
}